

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

size_t BrotliEncoderMaxCompressedSize(size_t input_size)

{
  ulong local_38;
  size_t result;
  size_t overhead;
  size_t num_large_blocks;
  size_t input_size_local;
  
  local_38 = input_size + (input_size >> 0xe) * 4 + 6;
  if (input_size == 0) {
    input_size_local = 2;
  }
  else {
    if (local_38 < input_size) {
      local_38 = 0;
    }
    input_size_local = local_38;
  }
  return input_size_local;
}

Assistant:

size_t BrotliEncoderMaxCompressedSize(size_t input_size) {
  /* [window bits / empty metadata] + N * [uncompressed] + [last empty] */
  size_t num_large_blocks = input_size >> 14;
  size_t overhead = 2 + (4 * num_large_blocks) + 3 + 1;
  size_t result = input_size + overhead;
  if (input_size == 0) return 2;
  return (result < input_size) ? 0 : result;
}